

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_act.c
# Opt level: O1

bool aedit_uvnum(CHAR_DATA *ch,char *argument)

{
  short sVar1;
  AREA_DATA_conflict *pAVar2;
  AREA_DATA_conflict *pAVar3;
  bool bVar4;
  int iVar5;
  AREA_DATA_conflict **ppAVar6;
  AREA_DATA_conflict *pAVar7;
  bool bVar8;
  int iVar9;
  char *txt;
  char upper [4608];
  char local_1228 [4616];
  
  pAVar2 = (AREA_DATA_conflict *)ch->desc->pEdit;
  one_argument(argument,local_1228);
  bVar4 = is_number(local_1228);
  txt = "Syntax:  max_vnum [#xupper]\n\r";
  bVar8 = false;
  if ((!bVar4) || (bVar8 = false, local_1228[0] == '\0')) goto LAB_00362462;
  sVar1 = pAVar2->min_vnum;
  iVar5 = atoi(local_1228);
  iVar9 = 0;
  bVar8 = false;
  if (iVar5 < sVar1) {
    txt = "AEdit:  Upper must be larger then lower.\n\r";
    goto LAB_00362462;
  }
  ppAVar6 = &area_first;
  do {
    ppAVar6 = &((AREA_DATA_conflict *)ppAVar6)->next->next;
    pAVar3 = area_first;
    if ((AREA_DATA_conflict *)ppAVar6 == (AREA_DATA_conflict *)0x0) goto joined_r0x0036240c;
    if ((sVar1 <= ((AREA_DATA_conflict *)ppAVar6)->min_vnum &&
         ((AREA_DATA_conflict *)ppAVar6)->min_vnum <= iVar5) ||
       (((AREA_DATA_conflict *)ppAVar6)->max_vnum <= iVar5 &&
        sVar1 <= ((AREA_DATA_conflict *)ppAVar6)->max_vnum)) {
      iVar9 = iVar9 + 1;
    }
  } while (iVar9 < 2);
  if ((AREA_DATA_conflict *)ppAVar6 == (AREA_DATA_conflict *)0x0) {
joined_r0x0036240c:
    do {
      if (pAVar3 == (AREA_DATA_conflict *)0x0) goto LAB_00362429;
      if ((pAVar3->min_vnum <= iVar5) && (pAVar7 = area_first, iVar5 <= pAVar3->max_vnum))
      goto LAB_0036244d;
      pAVar3 = pAVar3->next;
    } while( true );
  }
  txt = "AEdit:  Range must include only this area.\n\r";
  goto LAB_00362460;
LAB_0036244d:
  if (pAVar7 == (AREA_DATA_conflict *)0x0) goto code_r0x00362452;
  if ((pAVar7->min_vnum <= iVar5) && (iVar5 <= pAVar7->max_vnum)) goto LAB_00362454;
  pAVar7 = pAVar7->next;
  goto LAB_0036244d;
code_r0x00362452:
  pAVar7 = (AREA_DATA_conflict *)0x0;
LAB_00362454:
  if (pAVar7 == pAVar2) {
LAB_00362429:
    pAVar2->max_vnum = (short)iVar5;
    bVar8 = true;
    txt = "Upper vnum set.\n\r";
    goto LAB_00362462;
  }
  txt = "AEdit:  Upper vnum already assigned.\n\r";
LAB_00362460:
  bVar8 = false;
LAB_00362462:
  send_to_char(txt,ch);
  return bVar8;
}

Assistant:

bool aedit_uvnum(CHAR_DATA *ch, char *argument)
{
	AREA_DATA *pArea;
	char upper[MAX_STRING_LENGTH];
	int ilower;
	int iupper;

	EDIT_AREA(ch, pArea);

	one_argument(argument, upper);

	if (!is_number(upper) || upper[0] == '\0')
	{
		send_to_char("Syntax:  max_vnum [#xupper]\n\r", ch);
		return false;
	}

	if ((ilower = pArea->min_vnum) > (iupper = atoi(upper)))
	{
		send_to_char("AEdit:  Upper must be larger then lower.\n\r", ch);
		return false;
	}

	if (!check_range(ilower, iupper))
	{
		send_to_char("AEdit:  Range must include only this area.\n\r", ch);
		return false;
	}

	if (get_vnum_area(iupper) && get_vnum_area(iupper) != pArea)
	{
		send_to_char("AEdit:  Upper vnum already assigned.\n\r", ch);
		return false;
	}

	pArea->max_vnum = iupper;
	send_to_char("Upper vnum set.\n\r", ch);

	return true;
}